

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

double EDLines::ComputeMinDistanceBetweenTwoLines(LineSegment *ls1,LineSegment *ls2,int *pwhich)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint local_44;
  double dStack_40;
  int which;
  double min;
  double d;
  double dy;
  double dx;
  int *pwhich_local;
  LineSegment *ls2_local;
  LineSegment *ls1_local;
  
  dVar1 = ls1->sx - ls2->sx;
  dVar2 = ls1->sy - ls2->sy;
  dVar1 = sqrt(dVar1 * dVar1 + dVar2 * dVar2);
  dVar2 = ls1->sx - ls2->ex;
  dVar3 = ls1->sy - ls2->ey;
  dVar2 = sqrt(dVar2 * dVar2 + dVar3 * dVar3);
  dStack_40 = dVar1;
  if (dVar2 < dVar1) {
    dStack_40 = dVar2;
  }
  local_44 = (uint)(dVar2 < dVar1);
  dVar1 = ls1->ex - ls2->sx;
  dVar2 = ls1->ey - ls2->sy;
  dVar1 = sqrt(dVar1 * dVar1 + dVar2 * dVar2);
  if (dVar1 < dStack_40) {
    local_44 = 2;
    dStack_40 = dVar1;
  }
  dVar1 = ls1->ex - ls2->ex;
  dVar2 = ls1->ey - ls2->ey;
  dVar1 = sqrt(dVar1 * dVar1 + dVar2 * dVar2);
  if (dVar1 < dStack_40) {
    local_44 = 3;
    dStack_40 = dVar1;
  }
  if (pwhich != (int *)0x0) {
    *pwhich = local_44;
  }
  return dStack_40;
}

Assistant:

double EDLines::ComputeMinDistanceBetweenTwoLines(LineSegment * ls1, LineSegment * ls2, int * pwhich)
{
	double dx = ls1->sx - ls2->sx;
	double dy = ls1->sy - ls2->sy;
	double d = sqrt(dx*dx + dy*dy);
	double min = d;
	int which = SS;

	dx = ls1->sx - ls2->ex;
	dy = ls1->sy - ls2->ey;
	d = sqrt(dx*dx + dy*dy);
	if (d < min) { min = d; which = SE; }

	dx = ls1->ex - ls2->sx;
	dy = ls1->ey - ls2->sy;
	d = sqrt(dx*dx + dy*dy);
	if (d < min) { min = d; which = ES; }

	dx = ls1->ex - ls2->ex;
	dy = ls1->ey - ls2->ey;
	d = sqrt(dx*dx + dy*dy);
	if (d < min) { min = d; which = EE; }

	if (pwhich) *pwhich = which;
	return min;
}